

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O2

int b_array::first_ge<Map::Pair<int,std::__cxx11::string>>
              (Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *data,size_t size,
              Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *entry)

{
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar1;
  int iVar2;
  size_t i;
  ulong index;
  
  for (index = 0; size != index; index = index + 1) {
    pPVar1 = Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](data,index);
    if (entry->key <= pPVar1->key) break;
  }
  iVar2 = (int)size;
  if (index < size) {
    iVar2 = (int)index;
  }
  return iVar2;
}

Assistant:

int first_ge(const b_array::Array<T>& data, size_t size, const T& entry) {
    for (size_t i = 0; i < size; i++) {
        if (data[i] >= entry) {
            return i;
        }
    }
    return size;
}